

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexDecomposition.cpp
# Opt level: O3

void ConvexDecomposition::addTri
               (VertexLookup vl,UintVector *list,Vector3d *p1,Vector3d *p2,Vector3d *p3)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  uint *puVar6;
  ulong uVar7;
  int iVar8;
  
  uVar1 = Vl_getIndex(vl,&p1->x);
  uVar2 = Vl_getIndex(vl,&p2->x);
  uVar3 = Vl_getIndex(vl,&p3->x);
  if (uVar2 == uVar3) {
    return;
  }
  if (uVar1 == uVar2) {
    return;
  }
  if (uVar1 == uVar3) {
    return;
  }
  uVar4 = list->m_size;
  if (uVar4 == list->m_capacity) {
    iVar8 = 1;
    if (uVar4 != 0) {
      iVar8 = uVar4 * 2;
    }
    if ((int)uVar4 < iVar8) {
      if (iVar8 == 0) {
        puVar5 = (uint *)0x0;
      }
      else {
        puVar5 = (uint *)cbtAlignedAllocInternal((long)iVar8 << 2,0x10);
        uVar4 = list->m_size;
      }
      puVar6 = list->m_data;
      if ((int)uVar4 < 1) {
        if (puVar6 != (uint *)0x0) goto LAB_0090c3a7;
      }
      else {
        uVar7 = 0;
        do {
          puVar5[uVar7] = puVar6[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar4 != uVar7);
LAB_0090c3a7:
        if (list->m_ownsMemory == true) {
          cbtAlignedFreeInternal(puVar6);
        }
        uVar4 = list->m_size;
      }
      list->m_ownsMemory = true;
      list->m_data = puVar5;
      list->m_capacity = iVar8;
    }
  }
  puVar5 = list->m_data;
  puVar5[(int)uVar4] = uVar1;
  uVar1 = list->m_size + 1;
  list->m_size = uVar1;
  if (uVar1 == list->m_capacity) {
    iVar8 = 1;
    if (uVar1 != 0) {
      iVar8 = uVar1 * 2;
    }
    if ((int)uVar1 < iVar8) {
      if (iVar8 == 0) {
        puVar6 = (uint *)0x0;
      }
      else {
        puVar6 = (uint *)cbtAlignedAllocInternal((long)iVar8 << 2,0x10);
        uVar1 = list->m_size;
        puVar5 = list->m_data;
      }
      if ((int)uVar1 < 1) {
        if (puVar5 != (uint *)0x0) goto LAB_0090c434;
      }
      else {
        uVar7 = 0;
        do {
          puVar6[uVar7] = puVar5[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar1 != uVar7);
LAB_0090c434:
        if (list->m_ownsMemory == true) {
          cbtAlignedFreeInternal(puVar5);
        }
        uVar1 = list->m_size;
      }
      list->m_ownsMemory = true;
      list->m_data = puVar6;
      list->m_capacity = iVar8;
      puVar5 = puVar6;
    }
  }
  puVar5[(int)uVar1] = uVar2;
  uVar1 = list->m_size + 1;
  list->m_size = uVar1;
  if (uVar1 != list->m_capacity) goto LAB_0090c4db;
  iVar8 = 1;
  if (uVar1 != 0) {
    iVar8 = uVar1 * 2;
  }
  if (iVar8 <= (int)uVar1) goto LAB_0090c4db;
  if (iVar8 == 0) {
    puVar6 = (uint *)0x0;
  }
  else {
    puVar6 = (uint *)cbtAlignedAllocInternal((long)iVar8 << 2,0x10);
    uVar1 = list->m_size;
    puVar5 = list->m_data;
  }
  if ((int)uVar1 < 1) {
    if (puVar5 != (uint *)0x0) goto LAB_0090c4be;
  }
  else {
    uVar7 = 0;
    do {
      puVar6[uVar7] = puVar5[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
LAB_0090c4be:
    if (list->m_ownsMemory == true) {
      cbtAlignedFreeInternal(puVar5);
    }
    uVar1 = list->m_size;
  }
  list->m_ownsMemory = true;
  list->m_data = puVar6;
  list->m_capacity = iVar8;
  puVar5 = puVar6;
LAB_0090c4db:
  puVar5[(int)uVar1] = uVar3;
  list->m_size = list->m_size + 1;
  return;
}

Assistant:

void addTri(VertexLookup vl,UintVector &list,const Vector3d &p1,const Vector3d &p2,const Vector3d &p3)
{
  unsigned int i1 = Vl_getIndex(vl, p1.Ptr() );
  unsigned int i2 = Vl_getIndex(vl, p2.Ptr() );
  unsigned int i3 = Vl_getIndex(vl, p3.Ptr() );

  // do *not* process degenerate triangles!

  if ( i1 != i2 && i1 != i3 && i2 != i3 )
  {
    list.push_back(i1);
    list.push_back(i2);
    list.push_back(i3);
  }
}